

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_71760::ColorSwatchTextRegBits<>
          (anon_unknown_dwarf_71760 *this,Emulator *e,u8 v,PaletteRGBA pal_rgba,int color_index)

{
  ImDrawList *this_00;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 p;
  float sz;
  RGBA color_rgba;
  u8 color;
  int color_index_local;
  u8 v_local;
  Emulator *e_local;
  PaletteRGBA pal_rgba_local;
  
  pal_rgba_local.color._0_8_ = pal_rgba.color._0_8_;
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)pal_rgba.color[2]);
  color_rgba._0_1_ = (char)pal_rgba.color[2];
  p.y = (float)pal_rgba_local.color[(ulong)((byte)e >> ((char)color_rgba * '\x02' & 0x1fU) & 3) - 2]
  ;
  p.x = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  local_3c = ImGui::GetCursorScreenPos();
  this_00 = ImGui::GetWindowDrawList();
  ImVec2::ImVec2(&local_44,local_3c.x + p.x,local_3c.y + p.x);
  ImDrawList::AddRectFilled(this_00,&local_3c,&local_44,(ImU32)p.y,0.0,0);
  ImVec2::ImVec2(&local_4c,p.x,p.x);
  ImGui::Dummy(&local_4c);
  TextRegBits((Emulator *)this,(byte)e);
  return;
}

Assistant:

void ColorSwatchTextRegBits(Emulator* e, u8 v, PaletteRGBA pal_rgba,
                            int color_index, Args... args) {
  ImGui::SameLine();
  ImGui::Text("%d:", color_index);
  u8 color = (v >> (color_index * 2)) & 3;
  RGBA color_rgba = pal_rgba.color[color];
  float sz = ImGui::GetTextLineHeight();
  ImGui::SameLine();
  ImVec2 p = ImGui::GetCursorScreenPos();
  ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x + sz, p.y + sz),
                                            color_rgba);
  ImGui::Dummy(ImVec2(sz, sz));
  TextRegBits(e, v, args...);
}